

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rewriting.cpp
# Opt level: O2

tuple<NS_*,_NS_*,_NS_*,_NS_*> * test_graphs::nested_rewrite_example(void)

{
  NS *graph;
  N *pNVar1;
  NS *first;
  NS *this;
  NS *this_00;
  NS *rest;
  undefined8 *puVar2;
  NS *first_00;
  NS *rest_00;
  NS *rest_1;
  NS *first_01;
  NS *rest_01;
  NS *rest_1_00;
  NS *rest_2;
  NS *rest_3;
  N *this_01;
  N *this_02;
  int __fd;
  tuple<NS_*,_NS_*,_NS_*,_NS_*> *in_RDI;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_80 [40];
  __type local_58;
  
  graph = (NS *)operator_new(0x18);
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (graph->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pNVar1 = (N *)N::operator_new(0x78,graph);
  N::N<char_const*>(pNVar1,"");
  first = (NS *)operator_new(0x18);
  (first->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (first->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (first->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this = (NS *)operator_new(0x18);
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this_00 = (NS *)operator_new(0x18);
  *(undefined8 *)&(this_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_> = 0;
  *(pointer *)((long)&(this_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_> + 8) =
       (pointer)0x0;
  *(pointer *)((long)&(this_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_> + 0x10) =
       (pointer)0x0;
  rest = (NS *)operator_new(0x18);
  (rest->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (rest->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  puVar2 = (undefined8 *)operator_new(0x18);
  *puVar2 = 0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  first_00 = (NS *)operator_new(0x18);
  (first_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (first_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (first_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_00 = (NS *)operator_new(0x18);
  (rest_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_1 = (NS *)operator_new(0x18);
  (rest_1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_1->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  first_01 = (NS *)operator_new(0x18);
  (first_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (first_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (first_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_01 = (NS *)operator_new(0x18);
  (rest_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_01->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_1_00 = (NS *)operator_new(0x18);
  (rest_1_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_1_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_1_00->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_2 = (NS *)operator_new(0x18);
  (rest_2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_2->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  rest_3 = (NS *)operator_new(0x18);
  (rest_3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (rest_3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (rest_3->_os).super__Vector_base<N_*,_std::allocator<N_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  NS::wrap<NS*,NS*>((NS *)local_80,first,rest);
  NS::wrap<NS*,NS*,NS*>((__type *)(local_80 + 0x10),this,first_00,rest_00,rest_1);
  NS::wrap<NS*,NS*,NS*,NS*,NS*>(&local_58,this_00,first_01,rest_01,rest_1_00,rest_2,rest_3);
  __fd = (int)pNVar1;
  N::connect((N *)local_80._0_8_,__fd,(sockaddr *)local_a8,1);
  pNVar1 = (N *)N::operator_new(0x78,rest);
  N::N<char_const*>(pNVar1,"Lonely citizen");
  uVar3 = local_80._24_4_;
  uVar4 = local_80._28_4_;
  local_a8._0_8_ = local_80._32_8_;
  local_a8[8] = (char)uVar3;
  local_a8[9] = (char)((uint)uVar3 >> 8);
  local_a8[10] = (char)((uint)uVar3 >> 0x10);
  local_a8[0xb] = (char)((uint)uVar3 >> 0x18);
  local_a8[0xc] = (char)uVar4;
  local_a8[0xd] = (char)((uint)uVar4 >> 8);
  local_a8[0xe] = (char)((uint)uVar4 >> 0x10);
  local_a8[0xf] = (char)((uint)uVar4 >> 0x18);
  N::connect((N *)local_80._16_8_,__fd,(sockaddr *)local_a8,2);
  pNVar1 = (N *)N::operator_new(0x78,first_00);
  N::N<char_const*>(pNVar1,"Mother");
  this_01 = (N *)N::operator_new(0x78,rest_00);
  N::N<char_const*>(this_01,"Father");
  this_02 = (N *)N::operator_new(0x78,first_00);
  N::N<char_const*>(this_02,"Child");
  local_a8._8_8_ = this_01;
  local_a8._0_8_ = pNVar1;
  N::connect(this_02,__fd,(sockaddr *)local_a8,2);
  uVar3 = local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
          super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>._M_head_impl.
          _0_4_;
  uVar4 = local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
          super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Head_base<1UL,_N_*,_false>._M_head_impl.
          _4_4_;
  local_a8._0_8_ =
       local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.super__Head_base<0UL,_N_*,_false>.
       _M_head_impl;
  local_a8[8] = (char)uVar3;
  local_a8[9] = (char)((uint)uVar3 >> 8);
  local_a8[10] = (char)((uint)uVar3 >> 0x10);
  local_a8[0xb] = (char)((uint)uVar3 >> 0x18);
  local_a8[0xc] = (char)uVar4;
  local_a8[0xd] = (char)((uint)uVar4 >> 8);
  local_a8[0xe] = (char)((uint)uVar4 >> 0x10);
  local_a8[0xf] = (char)((uint)uVar4 >> 0x18);
  local_98._0_8_ =
       local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
       super__Head_base<2UL,_N_*,_false>._M_head_impl;
  local_98._8_4_ =
       (int)local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
            super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
            super__Tuple_impl<3UL,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl;
  local_98._12_4_ =
       local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
       super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
       super__Tuple_impl<3UL,_N_*,_N_*>.super__Head_base<3UL,_N_*,_false>._M_head_impl._4_4_;
  N::connect((N *)local_58.super__Tuple_impl<0UL,_N_*,_N_*,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<1UL,_N_*,_N_*,_N_*,_N_*>.super__Tuple_impl<2UL,_N_*,_N_*,_N_*>.
                  super__Tuple_impl<3UL,_N_*,_N_*>.super__Tuple_impl<4UL,_N_*>.
                  super__Head_base<4UL,_N_*,_false>._M_head_impl,__fd,(sockaddr *)local_a8,4);
  pNVar1 = (N *)N::operator_new(0x78,first_01);
  N::N<char_const*>(pNVar1,"Citizen");
  pNVar1 = (N *)N::operator_new(0x78,rest_01);
  N::N<char_const*>(pNVar1,"Citizen");
  pNVar1 = (N *)N::operator_new(0x78,rest_1_00);
  N::N<char_const*>(pNVar1,"Citizen");
  pNVar1 = (N *)N::operator_new(0x78,rest_2);
  N::N<char_const*>(pNVar1,"Citizen");
  (in_RDI->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*,_NS_*>).super__Tuple_impl<1UL,_NS_*,_NS_*,_NS_*>.
  super__Tuple_impl<2UL,_NS_*,_NS_*>.super__Tuple_impl<3UL,_NS_*>.super__Head_base<3UL,_NS_*,_false>
  ._M_head_impl = this_00;
  (in_RDI->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*,_NS_*>).super__Tuple_impl<1UL,_NS_*,_NS_*,_NS_*>.
  super__Tuple_impl<2UL,_NS_*,_NS_*>.super__Head_base<2UL,_NS_*,_false>._M_head_impl = this;
  (in_RDI->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*,_NS_*>).super__Tuple_impl<1UL,_NS_*,_NS_*,_NS_*>.
  super__Head_base<1UL,_NS_*,_false>._M_head_impl = first;
  (in_RDI->super__Tuple_impl<0UL,_NS_*,_NS_*,_NS_*,_NS_*>).super__Head_base<0UL,_NS_*,_false>.
  _M_head_impl = graph;
  return in_RDI;
}

Assistant:

std::tuple<NS*, NS*, NS*, NS*> test_graphs::nested_rewrite_example() {
    auto context = new NS();
    auto neighbour = new(context) N("");
    auto one_neighbour = new NS(), two_neighbours = new NS(), four_neighbours = new NS();
    auto f1 = new NS(), t1 = new NS(), g1 = new NS(), g2 = new NS(), t3 = new NS(), h1 = new NS(), h2 = new NS(), h3 = new NS(), h4 = new NS(), t5 = new NS();
    auto [f1n, t1n] = one_neighbour->wrap(f1, t1); auto [g1n, g2n, t3n] = two_neighbours->wrap(g1, g2, t3); auto [h1n, h2n, h3n, h4n, t5n] = four_neighbours->wrap(h1, h2, h3, h4, t5);

    t1n->connect(neighbour, {f1n});
    auto t1s = new(f1) N("Lonely citizen");

    t3n->connect(neighbour, {g1n, g2n});
    auto mother = new(g1) N("Mother");
    auto father = new(g2) N("Father");
    auto child = new(g1) N("Child");
    child->connect(neighbour, {mother, father});

    t5n->connect(neighbour, {h1n, h2n, h3n, h4n});
    auto x = new(h1) N("Citizen");
    auto y = new(h2) N("Citizen");
    auto z = new(h3) N("Citizen");
    auto w = new(h4) N("Citizen");

    return {context, one_neighbour, two_neighbours, four_neighbours};
}